

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTester.cpp
# Opt level: O1

void __thiscall HTester::testUpdate(HTester *this,int item)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int size_;
  uint iCol;
  uint uVar3;
  pointer piVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  int iVar13;
  undefined4 uVar14;
  undefined4 extraout_var;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  timeval tv_1;
  vector<int,_std::allocator<int>_> look;
  int fakeHint;
  HVector row_ep;
  string itemNames [5];
  HVector column;
  HTimer timer;
  double local_888;
  double local_880;
  double local_878;
  double local_870;
  double local_868;
  double local_860;
  timeval local_858;
  HModel *local_848;
  double local_840;
  double local_838;
  double local_830;
  double local_828;
  double local_820;
  double local_818;
  int local_80c;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  HFactor *local_7f8;
  double local_7f0;
  double local_7e8;
  undefined4 local_7dc;
  undefined1 **local_7d8;
  double local_7d0;
  HMatrix *local_7c8;
  long local_7c0;
  long local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_780;
  double local_778;
  vector<int,_std::allocator<int>_> local_770;
  int local_754;
  HVector local_750;
  double local_698;
  double dStack_690;
  double local_688;
  double dStack_680;
  undefined1 *local_678 [2];
  undefined1 local_668 [16];
  undefined1 *local_658 [2];
  undefined1 local_648 [16];
  undefined1 *local_638 [2];
  undefined1 local_628 [16];
  undefined1 *local_618 [2];
  undefined1 local_608 [16];
  undefined1 *local_5f8 [2];
  undefined1 local_5e8 [16];
  HVector local_5d8;
  HTimer local_520;
  
  if (item == 5) {
    testCFT(this);
    return;
  }
  local_678[0] = local_668;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"");
  local_658[0] = local_648;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"FT","");
  local_638[0] = local_628;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"PF","");
  local_618[0] = local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"MPF","");
  local_5f8[0] = local_5e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f8,"APF","");
  HTimer::HTimer(&local_520);
  memset(local_520.itemTicks,0,0xd0);
  gettimeofday((timeval *)&local_5d8,(__timezone_ptr_t)0x0);
  local_520.startTime =
       (double)(long)local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start / 1000000.0 +
       (double)CONCAT44(local_5d8.count,local_5d8.size);
  uVar6 = rdtsc();
  uVar14 = (undefined4)((ulong)uVar6 >> 0x20);
  auVar9._4_4_ = uVar14;
  auVar9._0_4_ = uVar14;
  auVar9._8_4_ = 0;
  auVar22._0_12_ = auVar9 << 0x20;
  auVar22._12_4_ = 0x45300000;
  local_520.startTick =
       (auVar22._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
  size_ = (this->model).numRow;
  iVar13 = (this->model).numTot;
  local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_750.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_750.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_750.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_750.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_750.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_750.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_750.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_750.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_750.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_750.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_750.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_750.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_750.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_750.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_750.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_750.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_750.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_750.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVector::setup(&local_5d8,size_);
  HVector::setup(&local_750,size_);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_770,(long)iVar13,(allocator_type *)&local_858);
  local_848 = &this->model;
  piVar4 = (this->model).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  HModel::changeUpdate(local_848,item);
  uVar6 = rdtsc();
  local_7b8 = CONCAT44(extraout_var,(int)((ulong)uVar6 >> 0x20));
  local_7dc = (undefined4)uVar6;
  local_7e8 = local_520.startTick;
  iVar13 = 0;
  gettimeofday(&local_858,(__timezone_ptr_t)0x0);
  lVar15 = (long)item;
  if (this->numPivot < 1) {
    local_888 = -1.0;
    local_7f0 = 1.0;
    local_820 = 0.0;
    local_818 = 0.0;
    local_880 = 0.0;
    local_838 = 0.0;
    local_860 = 0.0;
    local_828 = 0.0;
    local_830 = 0.0;
    local_868 = 0.0;
    local_878 = 0.0;
    local_870 = 0.0;
    local_848 = (HModel *)0x0;
    local_840 = 0.0;
  }
  else {
    local_7d0 = ((double)CONCAT44(local_858.tv_sec._4_4_,(int)local_858.tv_sec) +
                (double)local_858.tv_usec / 1000000.0) - local_520.startTime;
    local_7f8 = &(this->model).factor;
    dVar17 = (double)size_;
    local_7c8 = &(this->model).matrix;
    local_7d8 = local_678 + lVar15 * 4;
    local_880 = 0.0;
    local_878 = 0.0;
    uVar16 = 0;
    local_870 = 0.0;
    local_840 = 0.0;
    local_808 = 0;
    local_800 = 0;
    local_804 = 0;
    local_7fc = 0;
    local_80c = 0;
    local_830 = 0.0;
    local_828 = 0.0;
    local_838 = 0.0;
    local_7f0 = 1.0;
    local_818 = 0.0;
    local_820 = 0.0;
    local_7c0 = lVar15;
    do {
      iCol = (this->historyIn).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16];
      uVar3 = (this->historyOut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16];
      if ((iCol & uVar3) == 0xffffffff) {
        gettimeofday(&local_858,(__timezone_ptr_t)0x0);
        dVar18 = ((double)local_858.tv_usec / 1000000.0 +
                 (double)CONCAT44(local_858.tv_sec._4_4_,(int)local_858.tv_sec)) -
                 local_520.startTime;
        if (100.0 < dVar18 - local_7d0) {
          printf("Model=%-16s  item=%-3s  time=%-6.0f  where=%-3.0f\n",dVar18,
                 ((double)(int)uVar16 * 100.0) / (double)this->numPivot,
                 (this->modelName)._M_dataplus._M_p,*local_7d8);
          fflush(_stdout);
          local_7d0 = dVar18;
        }
        dVar18 = local_520.startTick;
        uVar6 = rdtsc();
        HModel::computeFactor(local_848);
        uVar7 = rdtsc();
        uVar14 = (undefined4)((ulong)uVar7 >> 0x20);
        auVar10._4_4_ = uVar14;
        auVar10._0_4_ = uVar14;
        auVar10._8_4_ = 0;
        auVar26._0_12_ = auVar10 << 0x20;
        auVar26._12_4_ = 0x45300000;
        if (0 < (this->model).numRow) {
          lVar15 = 0;
          do {
            local_770.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[piVar4[lVar15]] = (int)lVar15;
            lVar15 = lVar15 + 1;
          } while (lVar15 < (this->model).numRow);
        }
        auVar27._8_4_ = (int)((ulong)uVar6 >> 0x20);
        auVar27._0_8_ = uVar6;
        auVar27._12_4_ = 0x45300000;
        uVar1 = (this->model).factor.BtotalX;
        uVar2 = (this->model).factor.FtotalX;
        local_880 = local_880 +
                    (dVar18 - ((auVar27._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0))) +
                    (((auVar26._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) -
                    local_520.startTick);
        dVar18 = log((double)(int)uVar2 / (double)(int)uVar1);
        local_840 = local_840 + dVar18;
        iVar13 = iVar13 + 1;
        local_7fc = local_7fc + 1;
      }
      else {
        local_858.tv_sec._0_4_ =
             local_770.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[(int)uVar3];
        uVar6 = rdtsc();
        auVar23._8_4_ = (int)((ulong)uVar6 >> 0x20);
        auVar23._0_8_ = uVar6;
        auVar23._12_4_ = 0x45300000;
        local_688 = (double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0;
        dStack_680 = auVar23._8_8_ - 1.9342813113834067e+25;
        local_778 = local_520.startTick;
        HVector::clear(&local_750);
        local_750.packFlag = true;
        local_750.count = 1;
        *local_750.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = (int)local_858.tv_sec;
        local_750.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_858.tv_sec] = 1.0;
        HFactor::btran(local_7f8,&local_750,local_870);
        HVector::tight(&local_750);
        dVar19 = (double)local_750.count;
        local_780 = (dVar19 / dVar17) * 0.05;
        HVector::clear(&local_5d8);
        local_5d8.packFlag = true;
        HMatrix::collect_aj(local_7c8,&local_5d8,iCol,1.0);
        HFactor::ftran(local_7f8,&local_5d8,local_878);
        HVector::tight(&local_5d8);
        local_788 = (double)local_5d8.count / dVar17;
        local_7a8 = local_788 * 0.05;
        bVar8 = local_788 < 0.1;
        local_7a0 = (double)local_5d8.packCount;
        local_798 = (double)local_750.packCount;
        local_790 = (double)local_750.count;
        local_7f0 = local_7f0 + 1.0;
        HModel::updateFactor(local_848,&local_5d8,&local_750,(int *)&local_858,&local_754);
        uVar6 = rdtsc();
        uVar14 = (undefined4)((ulong)uVar6 >> 0x20);
        auVar11._4_4_ = uVar14;
        auVar11._0_4_ = uVar14;
        auVar11._8_4_ = 0;
        auVar24._0_12_ = auVar11 << 0x20;
        auVar24._12_4_ = 0x45300000;
        dStack_690 = auVar24._8_8_ - 1.9342813113834067e+25;
        local_698 = (dStack_690 + ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) -
                    local_520.startTick;
        local_7b0 = (this->historyAlpha).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar16];
        dVar20 = HMatrix::compute_dot(local_7c8,&local_750,iCol);
        dVar21 = ABS(local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)local_858.tv_sec]);
        dVar18 = ABS(dVar20);
        if (ABS(dVar20) <= dVar21) {
          dVar18 = dVar21;
        }
        if ((dVar18 + 1.0) * 1e-06 <
            ABS(local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_858.tv_sec] - dVar20)) {
          printf("Model=%-16s  item=%-3s  diff: ip=%d %f %f %f\n",local_7b0,
                 (this->modelName)._M_dataplus._M_p,*local_7d8,uVar16 & 0xffffffff);
        }
        local_870 = local_870 * 0.95 + local_780;
        local_878 = local_878 * 0.95 + local_7a8;
        local_830 = local_830 + local_7a0 / dVar17;
        local_828 = local_828 + local_798 / dVar17;
        local_820 = local_820 + local_788;
        local_818 = local_818 + local_790 / dVar17;
        local_838 = local_838 + (local_778 - (dStack_680 + local_688)) + local_698;
        local_80c = local_80c + 1;
        local_800 = local_800 + (uint)(dVar19 / dVar17 < 0.1);
        local_808 = local_808 + (uint)bVar8;
        local_804 = local_804 + 1;
        local_770.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)iCol] = (int)local_858.tv_sec;
        piVar4[(int)local_858.tv_sec] = iCol;
      }
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)this->numPivot);
    local_848 = (HModel *)(double)iVar13;
    local_860 = (double)local_80c;
    local_888 = (double)(local_7fc + -1);
    local_868 = (double)local_804;
    local_870 = (double)local_808 * 100.0;
    local_878 = (double)local_800 * 100.0;
    lVar15 = local_7c0;
  }
  auVar25._8_4_ = (int)local_7b8;
  auVar25._0_8_ = local_7b8 << 0x20;
  auVar25._12_4_ = 0x45300000;
  uVar6 = rdtsc();
  uVar14 = (undefined4)((ulong)uVar6 >> 0x20);
  auVar12._4_4_ = uVar14;
  auVar12._0_4_ = uVar14;
  auVar12._8_4_ = 0;
  auVar28._0_12_ = auVar12 << 0x20;
  auVar28._12_4_ = 0x45300000;
  local_7e8 = (local_7e8 -
              ((auVar25._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,local_7dc) - 4503599627370496.0))) +
              (((auVar28._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) - local_520.startTick
              );
  gettimeofday(&local_858,(__timezone_ptr_t)0x0);
  local_7f8 = (HFactor *)
              (((double)local_858.tv_usec / 1000000.0 +
               (double)CONCAT44(local_858.tv_sec._4_4_,(int)local_858.tv_sec)) - local_520.startTime
              );
  dVar17 = exp(local_840 / (double)local_848);
  printf("Model=%-16s  item=%-3s  fill=%f  interval=%d FTRAN=%10f  BTRAN=%10f  Fpack=%10.9f  Bpack=%10.9f  Ffull=%10.9f  Bfull=%10.9f  inv=%f  sol=%f\n"
         ,dVar17,local_870 / local_868,local_878 / local_868,local_830 / local_7f0,
         local_828 / local_7f0,local_820 / local_7f0,local_818 / local_7f0,
         (local_880 * (double)local_7f8) / local_7e8,(this->modelName)._M_dataplus._M_p,
         local_678[lVar15 * 4],(ulong)(uint)(int)(local_860 / local_888));
  if (local_770.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_770.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_750.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_750.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_750.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_750.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_750.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_750.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_750.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_750.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_750.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_750.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_750.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_750.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5d8.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d8.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5d8.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_5d8.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  lVar15 = 0;
  do {
    pcVar5 = *(char **)((long)&local_520.itemNames[0x19]._M_dataplus._M_p + lVar15);
    if (local_520.itemNames[0x19].field_2._M_local_buf + lVar15 != pcVar5) {
      operator_delete(pcVar5);
    }
    lVar15 = lVar15 + -0x20;
  } while (lVar15 != -0x340);
  lVar15 = 0;
  do {
    if (local_5e8 + lVar15 != *(undefined1 **)((long)local_5f8 + lVar15)) {
      operator_delete(*(undefined1 **)((long)local_5f8 + lVar15));
    }
    lVar15 = lVar15 + -0x20;
  } while (lVar15 != -0xa0);
  return;
}

Assistant:

void HTester::testUpdate(int item) {
    if (item == 5) {
        testCFT();
        return;
    }

    string itemNames[] = { "", "FT", "PF", "MPF", "APF" };

    HTimer timer;
    timer.reset();
    const int numRow = model.getNumRow();
    const int numTot = model.getNumTot();
    HVector column;
    HVector row_ep;
    column.setup(numRow);
    row_ep.setup(numRow);
    double column_dsty = 0;
    double row_ep_dsty = 0;

    vector<int> look(numTot);
    int *base = model.getBaseIndex();

    model.changeUpdate(item);

    double sumLnRate = 0;
    int countRate = 0;

    int countFTRAN = 0;
    int countBTRAN = 0;
    int countTotal = 0;

    double sumFTRANpack = 0;
    double sumBTRANpack = 0;
    double sumFTRANfull = 0;
    double sumBTRANfull = 0;
    double countSolve = 1;

    double invTick = 0;
    double solTick = 0;

    double totalTick = timer.getTick();
    double lastReportTime = timer.getTime();

    int totalUpdate = 0;
    int totalInvert = 0;

    for (int ip = 0; ip < numPivot; ip++) {
        // Refactor
        int columnIn = historyIn[ip];
        int columnOut = historyOut[ip];
        if (columnIn == -1 && columnOut == -1) {
            double time = timer.getTime();
            if (time - lastReportTime > 100) {
                printf("Model=%-16s  item=%-3s  time=%-6.0f  where=%-3.0f\n",
                        modelName.c_str(), itemNames[item].c_str(), time,
                        ((100.0 * ip) / numPivot));
                fflush(stdout);
                lastReportTime = time;
            }

            double tick1 = timer.getTick();
            model.computeFactor();
            invTick += timer.getTick() - tick1;
            for (int i = 0; i < model.getNumRow(); i++)
                look[base[i]] = i;

            double myRate = 1.0 * model.getFactor()->FtotalX
                    / model.getFactor()->BtotalX;
            sumLnRate += log(myRate);
            countRate++;

            totalInvert++;

            continue;
        }
        totalUpdate++;

        // The row out
        int rowOut = look[columnOut];

        double tick2 = timer.getTick();

        // Compute BTRAN
        row_ep.clear();
        row_ep.packFlag = true;
        row_ep.count = 1;
        row_ep.index[0] = rowOut;
        row_ep.array[rowOut] = 1;
        model.getFactor()->btran(row_ep, row_ep_dsty);
        row_ep.tight();
        double BTRANdsty = 1.0 * row_ep.count / numRow;
        row_ep_dsty = 0.95 * row_ep_dsty + 0.05 * BTRANdsty;
        countBTRAN += BTRANdsty < 0.1;

        // Compute FTRAN
        column.clear();
        column.packFlag = true;
        model.getMatrix()->collect_aj(column, columnIn, 1);
        model.getFactor()->ftran(column, column_dsty);
        column.tight();
        double FTRANdsty = 1.0 * column.count / numRow;
        column_dsty = 0.95 * column_dsty + 0.05 * FTRANdsty;
        countFTRAN += FTRANdsty < 0.1;
        countTotal++;

        sumFTRANpack += 1.0 * column.packCount / numRow;
        sumBTRANpack += 1.0 * row_ep.packCount / numRow;
        sumFTRANfull += 1.0 * column.count / numRow;
        sumBTRANfull += 1.0 * row_ep.count / numRow;
        countSolve ++;

        // Update factor
        int fakeHint;
        model.updateFactor(&column, &row_ep, &rowOut, &fakeHint);

        solTick += timer.getTick() - tick2;

        // Compare results
        double alpha = historyAlpha[ip];
        double alphaBTRAN = model.getMatrix()->compute_dot(row_ep, columnIn);
        double alphaFTRAN = column.array[rowOut];
        if (diff_double(alphaFTRAN, alphaBTRAN)) {
            printf("Model=%-16s  item=%-3s  diff: ip=%d %f %f %f\n",
                    modelName.c_str(), itemNames[item].c_str(), ip, alpha,
                    alphaFTRAN, alphaBTRAN);
        }

        // Update the basis
        look[columnIn] = rowOut;
        base[rowOut] = columnIn;
    }
    totalTick = timer.getTick() - totalTick;
    double totalTime = timer.getTime();
    double rate = exp(sumLnRate / countRate);
    printf(
            "Model=%-16s  item=%-3s  fill=%f  interval=%d FTRAN=%10f  BTRAN=%10f  Fpack=%10.9f  Bpack=%10.9f  Ffull=%10.9f  Bfull=%10.9f  inv=%f  sol=%f\n",
            modelName.c_str(), itemNames[item].c_str(), rate,
            (int) (1.0 * totalUpdate / (totalInvert - 1)),
            100.0 * countFTRAN / countTotal, 100.0 * countBTRAN / countTotal,
            sumFTRANpack / countSolve,
            sumBTRANpack / countSolve,
            sumFTRANfull / countSolve,
            sumBTRANfull / countSolve,
            totalTime * invTick / totalTick,
            totalTime * solTick / totalTick);
}